

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

xml_attribute<char> * __thiscall
rapidxml::xml_node<char>::first_attribute
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  byte *pbVar1;
  long lVar2;
  xml_attribute<char> *pxVar3;
  byte *pbVar4;
  char *end;
  size_t sVar5;
  byte *pbVar6;
  
  if (name == (char *)0x0) {
    return this->m_first_attribute;
  }
  if (name_size == 0) {
    name_size = 0xffffffffffffffff;
    do {
      lVar2 = name_size + 1;
      name_size = name_size + 1;
    } while (name[lVar2] != '\0');
  }
  pxVar3 = this->m_first_attribute;
  if (pxVar3 != (xml_attribute<char> *)0x0) {
    do {
      pbVar4 = (byte *)(pxVar3->super_xml_base<char>).m_name;
      if (pbVar4 == (byte *)0x0) {
        pbVar4 = &xml_base<char>::nullstr()::zero;
        sVar5 = 0;
      }
      else {
        sVar5 = (pxVar3->super_xml_base<char>).m_name_size;
      }
      if (sVar5 == name_size) {
        pbVar1 = pbVar4 + name_size;
        if (case_sensitive) {
          pbVar6 = (byte *)name;
          if ((long)name_size < 1) {
            return pxVar3;
          }
          while (*pbVar4 == *pbVar6) {
            pbVar4 = pbVar4 + 1;
            pbVar6 = pbVar6 + 1;
            if (pbVar1 <= pbVar4) {
              return pxVar3;
            }
          }
        }
        else {
          pbVar6 = (byte *)name;
          if ((long)name_size < 1) {
            return pxVar3;
          }
          while (internal::lookup_tables<0>::lookup_upcase[*pbVar4] ==
                 internal::lookup_tables<0>::lookup_upcase[*pbVar6]) {
            pbVar4 = pbVar4 + 1;
            pbVar6 = pbVar6 + 1;
            if (pbVar1 <= pbVar4) {
              return pxVar3;
            }
          }
        }
      }
      pxVar3 = pxVar3->m_next_attribute;
    } while (pxVar3 != (xml_attribute<char> *)0x0);
    return (xml_attribute<char> *)0x0;
  }
  return (xml_attribute<char> *)0x0;
}

Assistant:

xml_attribute<Ch> *first_attribute(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_attribute<Ch> *attribute = m_first_attribute; attribute; attribute = attribute->m_next_attribute)
                    if (internal::compare(attribute->name(), attribute->name_size(), name, name_size, case_sensitive))
                        return attribute;
                return 0;
            }
            else
                return m_first_attribute;
        }